

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut.c
# Opt level: O3

void Sbd_StoFree(Sbd_Sto_t *p)

{
  int *piVar1;
  Vec_Wec_t *__ptr;
  void *__ptr_00;
  Vec_Mem_t *pVVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  long lVar5;
  long lVar6;
  
  pVVar4 = p->vDelays;
  piVar1 = pVVar4->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar4);
  pVVar4 = p->vLevels;
  piVar1 = pVVar4->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar4);
  pVVar4 = p->vRefs;
  piVar1 = pVVar4->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar4);
  __ptr = p->vCuts;
  iVar3 = __ptr->nCap;
  pVVar4 = __ptr->pArray;
  if (iVar3 < 1) {
    if (pVVar4 != (Vec_Int_t *)0x0) goto LAB_00544fed;
  }
  else {
    lVar6 = 8;
    lVar5 = 0;
    do {
      __ptr_00 = *(void **)((long)&pVVar4->nCap + lVar6);
      if (__ptr_00 != (void *)0x0) {
        free(__ptr_00);
        pVVar4 = __ptr->pArray;
        *(undefined8 *)((long)&pVVar4->nCap + lVar6) = 0;
        iVar3 = __ptr->nCap;
      }
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 0x10;
    } while (lVar5 < iVar3);
LAB_00544fed:
    free(pVVar4);
  }
  free(__ptr);
  if (p->fCutMin == 0) goto LAB_005450e8;
  pVVar2 = p->vTtMem;
  if (pVVar2 != (Vec_Mem_t *)0x0) {
    pVVar4 = pVVar2->vTable;
    if (pVVar4 != (Vec_Int_t *)0x0) {
      if (pVVar4->pArray != (int *)0x0) {
        free(pVVar4->pArray);
        pVVar2->vTable->pArray = (int *)0x0;
        pVVar4 = pVVar2->vTable;
        if (pVVar4 == (Vec_Int_t *)0x0) goto LAB_00545049;
      }
      free(pVVar4);
      pVVar2->vTable = (Vec_Int_t *)0x0;
    }
LAB_00545049:
    pVVar4 = pVVar2->vNexts;
    if (pVVar4 != (Vec_Int_t *)0x0) {
      if (pVVar4->pArray != (int *)0x0) {
        free(pVVar4->pArray);
        pVVar2->vNexts->pArray = (int *)0x0;
        pVVar4 = pVVar2->vNexts;
        if (pVVar4 == (Vec_Int_t *)0x0) goto LAB_00545085;
      }
      free(pVVar4);
      pVVar2->vNexts = (Vec_Int_t *)0x0;
    }
  }
LAB_00545085:
  if (p->fCutMin != 0) {
    pVVar2 = p->vTtMem;
    iVar3 = pVVar2->iPage;
    if (-1 < iVar3) {
      lVar5 = -1;
      do {
        if (pVVar2->ppPages[lVar5 + 1] != (word *)0x0) {
          free(pVVar2->ppPages[lVar5 + 1]);
          pVVar2->ppPages[lVar5 + 1] = (word *)0x0;
          iVar3 = pVVar2->iPage;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < iVar3);
    }
    if (pVVar2->ppPages != (word **)0x0) {
      free(pVVar2->ppPages);
    }
    free(pVVar2);
    if (p == (Sbd_Sto_t *)0x0) {
      return;
    }
  }
LAB_005450e8:
  free(p);
  return;
}

Assistant:

void Sbd_StoFree( Sbd_Sto_t * p )
{
    Vec_IntFree( p->vDelays );
    Vec_IntFree( p->vLevels );
    Vec_IntFree( p->vRefs );
    Vec_WecFree( p->vCuts );
    if ( p->fCutMin )
        Vec_MemHashFree( p->vTtMem );
    if ( p->fCutMin )
        Vec_MemFree( p->vTtMem );
    ABC_FREE( p );
}